

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QList<QGesture_*> * __thiscall
QMap<QGestureManager::ObjectGesture,_QList<QGesture_*>_>::value
          (QList<QGesture_*> *__return_storage_ptr__,
          QMap<QGestureManager::ObjectGesture,_QList<QGesture_*>_> *this,ObjectGesture *key,
          QList<QGesture_*> *defaultValue)

{
  QMapData<std::map<QGestureManager::ObjectGesture,_QList<QGesture_*>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  qsizetype qVar3;
  _Base_ptr p_Var4;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<QGestureManager::ObjectGesture,_QList<QGesture_*>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<QGestureManager::ObjectGesture,_std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>,_std::_Select1st<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      p_Var4 = cVar2._M_node[1]._M_left;
      (__return_storage_ptr__->d).d = (Data *)p_Var4;
      (__return_storage_ptr__->d).ptr = (QGesture **)cVar2._M_node[1]._M_right;
      qVar3 = *(qsizetype *)(cVar2._M_node + 2);
      goto LAB_002d842f;
    }
  }
  p_Var4 = (_Base_ptr)(defaultValue->d).d;
  (__return_storage_ptr__->d).d = (Data *)p_Var4;
  (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
  qVar3 = (defaultValue->d).size;
LAB_002d842f:
  (__return_storage_ptr__->d).size = qVar3;
  if (p_Var4 != (_Base_ptr)0x0) {
    LOCK();
    p_Var4->_M_color = p_Var4->_M_color + _S_black;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }